

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_abstract_transaction.cpp
# Opt level: O0

void __thiscall
AbstractTransaction_AddTxOut_RemoveTxOut_Test::TestBody
          (AbstractTransaction_AddTxOut_RemoveTxOut_Test *this)

{
  bool bVar1;
  AbstractTxOutReference *pAVar2;
  char *pcVar3;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  AssertHelper local_260;
  Message local_258;
  uint local_24c;
  undefined1 local_248 [8];
  AssertionResult gtest_ar_3;
  Message local_230;
  AssertHelper local_228;
  Message local_220 [2];
  CfdException *anon_var_0;
  char *pcStack_208;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  Message local_1f8;
  uint local_1ec;
  undefined1 local_1e8 [8];
  AssertionResult gtest_ar_2;
  Message local_1d0;
  Script local_1c8;
  string local_190 [32];
  undefined1 local_170 [8];
  AssertionResult gtest_ar_1;
  Message local_158;
  undefined8 local_150;
  undefined1 local_148;
  undefined8 local_140;
  undefined1 local_138;
  undefined1 local_130 [8];
  AssertionResult gtest_ar;
  vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_> list;
  AssertHelper local_108;
  Message local_100;
  allocator local_f1;
  string local_f0 [32];
  Script local_d0;
  _func_int **local_98;
  undefined1 local_90;
  undefined1 local_88 [40];
  Transaction tx;
  unsigned_long local_28;
  uint64_t satoshi;
  undefined4 local_18;
  uint32_t locktime;
  int32_t version;
  uint32_t txout_count;
  AbstractTransaction_AddTxOut_RemoveTxOut_Test *this_local;
  
  locktime = 1;
  local_18 = 2;
  satoshi._4_4_ = 3;
  local_28 = 0x12345678;
  _version = this;
  cfd::core::Transaction::Transaction((Transaction *)(local_88 + 0x20),2,3);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_98 = (_func_int **)cfd::core::Amount::CreateBySatoshiAmount(local_28);
      local_90 = extraout_DL;
      local_88._0_8_ = local_98;
      local_88[8] = extraout_DL;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_f0,"0014913e0b9281dab16f502101ad4e655074396f34c5",&local_f1);
      cfd::core::Script::Script(&local_d0,local_f0);
      cfd::core::Transaction::AddTxOut((Amount *)(local_88 + 0x20),(Script *)local_88);
      cfd::core::Script::~Script(&local_d0);
      std::__cxx11::string::~string(local_f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_f1);
    }
  }
  else {
    testing::Message::Message(&local_100);
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0xeb,
               "Expected: tx.AddTxOut(Amount::CreateBySatoshiAmount(satoshi), Script(\"0014913e0b9281dab16f502101ad4e655074396f34c5\")) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_108,&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    testing::Message::~Message(&local_100);
  }
  cfd::core::Transaction::GetTxOutList();
  pAVar2 = (AbstractTxOutReference *)
           std::vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>::
           operator[]((vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>
                       *)&gtest_ar.message_,0);
  local_150 = cfd::core::AbstractTxOutReference::GetValue(pAVar2);
  local_148 = extraout_DL_00;
  local_140 = local_150;
  local_138 = extraout_DL_00;
  testing::internal::EqHelper<false>::Compare<cfd::core::Amount,unsigned_long>
            ((EqHelper<false> *)local_130,"list[0].GetValue()","satoshi",(Amount *)&local_140,
             &local_28);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
  if (!bVar1) {
    testing::Message::Message(&local_158);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_130);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0xee,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_158);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_158);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
  pAVar2 = (AbstractTxOutReference *)
           std::vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>::
           operator[]((vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>
                       *)&gtest_ar.message_,0);
  cfd::core::AbstractTxOutReference::GetLockingScript(&local_1c8,pAVar2);
  cfd::core::Script::GetHex_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_170,"list[0].GetLockingScript().GetHex().c_str()",
             "\"0014913e0b9281dab16f502101ad4e655074396f34c5\"",pcVar3,
             "0014913e0b9281dab16f502101ad4e655074396f34c5");
  std::__cxx11::string::~string(local_190);
  cfd::core::Script::~Script(&local_1c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_170);
  if (!bVar1) {
    testing::Message::Message(&local_1d0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_170);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0xf0,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_1d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_1d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_170);
  local_1ec = cfd::core::Transaction::GetTxOutCount();
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            ((EqHelper<false> *)local_1e8,"tx.GetTxOutCount()","txout_count",&local_1ec,&locktime);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e8);
  if (!bVar1) {
    testing::Message::Message(&local_1f8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_msg,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0xf1,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_msg,&local_1f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_msg);
    testing::Message::~Message(&local_1f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e8);
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffffdf8,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffffdf8);
  if (bVar1) {
    anon_var_0._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Transaction::RemoveTxOut((int)local_88 + 0x20);
    }
    if ((anon_var_0._7_1_ & 1) != 0) goto LAB_002b3b94;
    pcStack_208 = 
    "Expected: tx.RemoveTxOut(3) throws an exception of type CfdException.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_220);
  testing::internal::AssertHelper::AssertHelper
            (&local_228,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_abstract_transaction.cpp"
             ,0xf4,pcStack_208);
  testing::internal::AssertHelper::operator=(&local_228,local_220);
  testing::internal::AssertHelper::~AssertHelper(&local_228);
  testing::Message::~Message(local_220);
LAB_002b3b94:
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Transaction::RemoveTxOut((int)local_88 + 0x20);
    }
  }
  else {
    testing::Message::Message(&local_230);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0xf6,
               "Expected: tx.RemoveTxOut(0) doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_230);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_230);
  }
  locktime = locktime - 1;
  local_24c = cfd::core::Transaction::GetTxOutCount();
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            ((EqHelper<false> *)local_248,"tx.GetTxOutCount()","txout_count",&local_24c,&locktime);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_248);
  if (!bVar1) {
    testing::Message::Message(&local_258);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_248);
    testing::internal::AssertHelper::AssertHelper
              (&local_260,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0xf8,pcVar3);
    testing::internal::AssertHelper::operator=(&local_260,&local_258);
    testing::internal::AssertHelper::~AssertHelper(&local_260);
    testing::Message::~Message(&local_258);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_248);
  std::vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>::~vector
            ((vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_> *)
             &gtest_ar.message_);
  cfd::core::Transaction::~Transaction((Transaction *)(local_88 + 0x20));
  return;
}

Assistant:

TEST(AbstractTransaction, AddTxOut_RemoveTxOut) {
  uint32_t txout_count = 1;
  int32_t version = 2;
  uint32_t locktime = 3;
  uint64_t satoshi = 0x12345678;

  Transaction tx(version, locktime);
  // script is not empty
  EXPECT_NO_THROW(
      tx.AddTxOut(Amount::CreateBySatoshiAmount(satoshi),
                  Script("0014913e0b9281dab16f502101ad4e655074396f34c5")));

  std::vector<TxOutReference> list = tx.GetTxOutList();
  EXPECT_EQ(list[0].GetValue(), satoshi);
  EXPECT_STREQ(list[0].GetLockingScript().GetHex().c_str(),
      "0014913e0b9281dab16f502101ad4e655074396f34c5");
  EXPECT_EQ(tx.GetTxOutCount(), txout_count);

  // index error
  EXPECT_THROW(tx.RemoveTxOut(3), CfdException);
  // remove success
  EXPECT_NO_THROW(tx.RemoveTxOut(0));
  txout_count--;
  EXPECT_EQ(tx.GetTxOutCount(), txout_count);
}